

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O0

Matrix33 *
AML::eulerAngles2DCM_XYZ(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_98;
  double data [3] [3];
  double sinPsi;
  double cosPsi;
  double sinTheta;
  double cosTheta;
  double sinPhi;
  double cosPhi;
  double psi_local;
  double theta_local;
  double phi_local;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dVar5 = cos(psi);
  data[2][2] = sin(psi);
  local_98 = dVar5 * dVar3;
  data[0][0] = dVar3 * data[2][2];
  data[0][1] = -dVar4;
  data[0][2] = dVar5 * dVar4 * dVar2 + -(data[2][2] * dVar1);
  data[1][0] = data[2][2] * dVar4 * dVar2 + dVar5 * dVar1;
  data[1][1] = dVar2 * dVar3;
  data[1][2] = dVar5 * dVar4 * dVar1 + data[2][2] * dVar2;
  data[2][0] = data[2][2] * dVar4 * dVar1 + -(dVar5 * dVar2);
  data[2][1] = dVar3 * dVar1;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_98);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngles2DCM_XYZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cosPsi = cos(psi);
        const double sinPsi = sin(psi);

        double data[3][3];
        data[0][0] = cosPsi * cosTheta;
        data[0][1] = cosTheta * sinPsi;
        data[0][2] = -sinTheta;
        data[1][0] = cosPsi * sinTheta * sinPhi - sinPsi * cosPhi;
        data[1][1] = sinPsi * sinTheta * sinPhi + cosPsi * cosPhi;
        data[1][2] = sinPhi * cosTheta;
        data[2][0] = cosPsi * sinTheta * cosPhi + sinPsi * sinPhi;
        data[2][1] = sinPsi * sinTheta * cosPhi - cosPsi * sinPhi;
        data[2][2] = cosTheta * cosPhi;
        return Matrix33(data);
    }